

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::FuncArgsContext::markDstRegsDirty(FuncArgsContext *this,FuncFrame *frame)

{
  undefined8 in_RAX;
  WorkData *pWVar1;
  uint regs;
  Iterator __begin2;
  char cVar2;
  RegGroup group;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  for (cVar2 = '\0'; cVar2 != '\x04'; cVar2 = cVar2 + '\x01') {
    uStack_28 = CONCAT17(cVar2,(undefined7)uStack_28);
    pWVar1 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
             operator[]<asmjit::v1_14::RegGroup>
                       (&this->_workData,(RegGroup *)((long)&uStack_28 + 7));
    regs = pWVar1->_dstShuf | pWVar1->_usedRegs;
    pWVar1->_workRegs = pWVar1->_workRegs | regs;
    FuncFrame::addDirtyRegs(frame,uStack_28._7_1_,regs);
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsContext::markDstRegsDirty(FuncFrame& frame) noexcept {
  for (RegGroup group : RegGroupVirtValues{}) {
    WorkData& wd = _workData[group];
    uint32_t regs = wd.usedRegs() | wd._dstShuf;

    wd._workRegs |= regs;
    frame.addDirtyRegs(group, regs);
  }

  return kErrorOk;
}